

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Comparison.cpp
# Opt level: O3

bool CoreML::Specification::operator==(GLMClassifier *a,GLMClassifier *b)

{
  uint32 uVar1;
  bool bVar2;
  
  bVar2 = operator==(&a->weights_,&b->weights_);
  if ((((!bVar2) || (bVar2 = operator==(&a->offset_,&b->offset_), !bVar2)) ||
      (a->postevaluationtransform_ != b->postevaluationtransform_)) ||
     ((a->classencoding_ != b->classencoding_ ||
      (uVar1 = a->_oneof_case_[0], uVar1 != b->_oneof_case_[0])))) {
    return false;
  }
  if (uVar1 == 0) {
    return true;
  }
  if (uVar1 != 100) {
    bVar2 = vectorsEqual<CoreML::Specification::Int64Vector>
                      ((a->ClassLabels_).int64classlabels_,(b->ClassLabels_).int64classlabels_);
    return bVar2;
  }
  bVar2 = vectorsEqual<CoreML::Specification::StringVector>
                    ((a->ClassLabels_).stringclasslabels_,(b->ClassLabels_).stringclasslabels_);
  return bVar2;
}

Assistant:

bool operator==(const GLMClassifier& a,
                        const GLMClassifier& b) {
            if (a.weights() != b.weights()) {
                return false;
            }
            if (a.offset() != b.offset()) {
                return false;
            }
            if (a.postevaluationtransform() != b.postevaluationtransform()) {
                return false;
            }
            if (a.classencoding() != b.classencoding()) {
                return false;
            }
            if (a.ClassLabels_case() != b.ClassLabels_case()) {
                return false;
            }
            switch (a.ClassLabels_case()) {
                case GLMClassifier::kInt64ClassLabels:
                    return a.int64classlabels() == b.int64classlabels();
                case GLMClassifier::kStringClassLabels:
                    return a.stringclasslabels() == b.stringclasslabels();
                case GLMClassifier::CLASSLABELS_NOT_SET:
                    return true;
            }
        }